

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUseMangledMesaCommand.cxx
# Opt level: O0

void __thiscall
cmUseMangledMesaCommand::CopyAndFullPathMesaHeader
          (cmUseMangledMesaCommand *this,string *source,string *outdir)

{
  byte bVar1;
  bool bVar2;
  char *pcVar3;
  ostream *poVar4;
  string local_810;
  undefined1 local_7f0 [8];
  string gfile;
  string includeFile;
  RegularExpression glLine;
  RegularExpression glDirLine;
  RegularExpression includeLine;
  string inLine;
  long local_500;
  ifstream fin;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  undefined1 local_2b0 [8];
  ofstream fout;
  string tempOutputFile;
  string outFile;
  undefined1 local_60 [8];
  string file;
  string dir;
  string *outdir_local;
  string *source_local;
  cmUseMangledMesaCommand *this_local;
  
  std::__cxx11::string::string((string *)(file.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_60);
  cmsys::SystemTools::SplitProgramPath
            (source,(string *)(file.field_2._M_local_buf + 8),(string *)local_60,true);
  std::__cxx11::string::string((string *)(tempOutputFile.field_2._M_local_buf + 8),(string *)outdir)
  ;
  std::__cxx11::string::operator+=((string *)(tempOutputFile.field_2._M_local_buf + 8),"/");
  std::__cxx11::string::operator+=
            ((string *)(tempOutputFile.field_2._M_local_buf + 8),(string *)local_60);
  std::__cxx11::string::string
            ((string *)&fout.field_0x1f8,(string *)(tempOutputFile.field_2._M_local_buf + 8));
  std::__cxx11::string::operator+=((string *)&fout.field_0x1f8,".tmp");
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_2b0,pcVar3,_S_out);
  bVar1 = std::ios::operator!((ios *)(local_2b0 + (long)*(_func_int **)((long)local_2b0 + -0x18)));
  if ((bVar1 & 1) == 0) {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::ifstream::ifstream(&local_500,pcVar3,_S_in);
    bVar1 = std::ios::operator!((ios *)((long)&local_500 + *(long *)(local_500 + -0x18)));
    if ((bVar1 & 1) == 0) {
      std::__cxx11::string::string((string *)&includeLine.progsize);
      cmsys::RegularExpression::RegularExpression
                ((RegularExpression *)&glDirLine.progsize,
                 "^[ \t]*#[ \t]*include[ \t]*[<\"]([^\">]+)[\">]");
      cmsys::RegularExpression::RegularExpression
                ((RegularExpression *)&glLine.progsize,"(gl|GL)(/|\\\\)([^<\"]+)");
      cmsys::RegularExpression::RegularExpression
                ((RegularExpression *)((long)&includeFile.field_2 + 8),"(gl|GL|xmesa)");
      while (bVar2 = cmsys::SystemTools::GetLineFromStream
                               ((istream *)&local_500,(string *)&includeLine.progsize,(bool *)0x0,-1
                               ), bVar2) {
        bVar2 = cmsys::RegularExpression::find
                          ((RegularExpression *)&glDirLine.progsize,(string *)&includeLine.progsize)
        ;
        if (bVar2) {
          cmsys::RegularExpression::match_abi_cxx11_
                    ((string *)((long)&gfile.field_2 + 8),(RegularExpression *)&glDirLine.progsize,1
                    );
          bVar2 = cmsys::RegularExpression::find
                            ((RegularExpression *)&glLine.progsize,
                             (string *)((long)&gfile.field_2 + 8));
          if (bVar2) {
            cmsys::RegularExpression::match_abi_cxx11_
                      ((string *)local_7f0,(RegularExpression *)&glLine.progsize,3);
            poVar4 = std::operator<<((ostream *)local_2b0,"#include \"");
            poVar4 = std::operator<<(poVar4,(string *)outdir);
            poVar4 = std::operator<<(poVar4,"/");
            poVar4 = std::operator<<(poVar4,(string *)local_7f0);
            std::operator<<(poVar4,"\"\n");
            std::__cxx11::string::~string((string *)local_7f0);
          }
          else {
            bVar2 = cmsys::RegularExpression::find
                              ((RegularExpression *)((long)&includeFile.field_2 + 8),
                               (string *)((long)&gfile.field_2 + 8));
            if (bVar2) {
              poVar4 = std::operator<<((ostream *)local_2b0,"#include \"");
              poVar4 = std::operator<<(poVar4,(string *)outdir);
              poVar4 = std::operator<<(poVar4,"/");
              cmsys::RegularExpression::match_abi_cxx11_
                        (&local_810,(RegularExpression *)&glDirLine.progsize,1);
              poVar4 = std::operator<<(poVar4,(string *)&local_810);
              std::operator<<(poVar4,"\"\n");
              std::__cxx11::string::~string((string *)&local_810);
            }
            else {
              poVar4 = std::operator<<((ostream *)local_2b0,(string *)&includeLine.progsize);
              std::operator<<(poVar4,"\n");
            }
          }
          std::__cxx11::string::~string((string *)(gfile.field_2._M_local_buf + 8));
        }
        else {
          poVar4 = std::operator<<((ostream *)local_2b0,(string *)&includeLine.progsize);
          std::operator<<(poVar4,"\n");
        }
      }
      std::ifstream::close();
      std::ofstream::close();
      cmsys::SystemTools::CopyFileIfDifferent
                ((string *)&fout.field_0x1f8,(string *)((long)&tempOutputFile.field_2 + 8));
      cmsys::SystemTools::RemoveFile((string *)&fout.field_0x1f8);
      cmsys::RegularExpression::~RegularExpression
                ((RegularExpression *)((long)&includeFile.field_2 + 8));
      cmsys::RegularExpression::~RegularExpression((RegularExpression *)&glLine.progsize);
      cmsys::RegularExpression::~RegularExpression((RegularExpression *)&glDirLine.progsize);
      std::__cxx11::string::~string((string *)&includeLine.progsize);
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&inLine.field_2 + 8),"Could not open file for read in copy operation",
                     source);
      cmSystemTools::Error((string *)((long)&inLine.field_2 + 8));
      std::__cxx11::string::~string((string *)(inLine.field_2._M_local_buf + 8));
    }
    std::ifstream::~ifstream(&local_500);
  }
  else {
    std::operator+(&local_2f0,"Could not open file for write in copy operation: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &fout.field_0x1f8);
    std::operator+(&local_2d0,&local_2f0,outdir);
    cmSystemTools::Error(&local_2d0);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_2f0);
    cmSystemTools::ReportLastSystemError("");
  }
  std::ofstream::~ofstream(local_2b0);
  std::__cxx11::string::~string((string *)&fout.field_0x1f8);
  std::__cxx11::string::~string((string *)(tempOutputFile.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(file.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmUseMangledMesaCommand::CopyAndFullPathMesaHeader(
  const std::string& source, const std::string& outdir)
{
  std::string dir, file;
  cmSystemTools::SplitProgramPath(source, dir, file);
  std::string outFile = outdir;
  outFile += "/";
  outFile += file;
  std::string tempOutputFile = outFile;
  tempOutputFile += ".tmp";
  cmsys::ofstream fout(tempOutputFile.c_str());
  if (!fout) {
    cmSystemTools::Error("Could not open file for write in copy operation: " +
                         tempOutputFile + outdir);
    cmSystemTools::ReportLastSystemError("");
    return;
  }
  cmsys::ifstream fin(source.c_str());
  if (!fin) {
    cmSystemTools::Error("Could not open file for read in copy operation" +
                         source);
    return;
  }
  // now copy input to output and expand variables in the
  // input file at the same time
  std::string inLine;
  // regular expression for any #include line
  cmsys::RegularExpression includeLine(
    "^[ \t]*#[ \t]*include[ \t]*[<\"]([^\">]+)[\">]");
  // regular expression for gl/ or GL/ in a file (match(1) of above)
  cmsys::RegularExpression glDirLine(R"((gl|GL)(/|\\)([^<"]+))");
  // regular expression for gl GL or xmesa in a file (match(1) of above)
  cmsys::RegularExpression glLine("(gl|GL|xmesa)");
  while (cmSystemTools::GetLineFromStream(fin, inLine)) {
    if (includeLine.find(inLine)) {
      std::string includeFile = includeLine.match(1);
      if (glDirLine.find(includeFile)) {
        std::string gfile = glDirLine.match(3);
        fout << "#include \"" << outdir << "/" << gfile << "\"\n";
      } else if (glLine.find(includeFile)) {
        fout << "#include \"" << outdir << "/" << includeLine.match(1)
             << "\"\n";
      } else {
        fout << inLine << "\n";
      }
    } else {
      fout << inLine << "\n";
    }
  }
  // close the files before attempting to copy
  fin.close();
  fout.close();
  cmSystemTools::CopyFileIfDifferent(tempOutputFile, outFile);
  cmSystemTools::RemoveFile(tempOutputFile);
}